

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

uint64_t __thiscall
flatbuffers::BinaryAnnotator::BuildHeader(BinaryAnnotator *this,uint64_t header_offset)

{
  size_t points_to_offset;
  bool bVar1;
  unsigned_long *puVar2;
  uint *puVar3;
  Object *this_00;
  String *this_01;
  undefined1 *offset_00;
  Optional<unsigned_long> OVar4;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_738;
  allocator<char> local_719;
  string local_718;
  BinarySection local_6f8;
  BinaryRegionComment local_6b8;
  BinaryRegion local_640;
  undefined1 local_5a0 [8];
  BinaryRegionComment comment;
  BinaryRegion local_4b0;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  undefined1 local_3c8 [8];
  BinaryRegionComment root_offset_comment;
  uint64_t root_table_loc;
  Optional<unsigned_int> root_table_offset;
  BinaryRegionComment local_318;
  BinaryRegion local_2a0;
  _Optional_payload_base<unsigned_int> local_200;
  Optional<unsigned_int> prefix_length_1;
  BinaryRegion local_180;
  _Storage<unsigned_long,_true> local_d0;
  Optional<unsigned_long> prefix_length;
  undefined1 local_b8 [7];
  bool has_prefix_value;
  BinaryRegionComment prefix_length_comment;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  uint64_t offset;
  uint64_t header_offset_local;
  BinaryAnnotator *this_local;
  
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
             &prefix_length_comment.index);
  regions.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)header_offset;
  if ((this->is_size_prefixed_ & 1U) != 0) {
    BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_b8);
    prefix_length_comment.status_message.field_2._8_4_ = 1;
    prefix_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._15_1_ = 0;
    OVar4 = ReadScalar<unsigned_long>(this,header_offset);
    local_d0._M_value =
         OVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    prefix_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         OVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_d0);
    if (*puVar2 <= this->binary_length_) {
      BinaryRegionComment::BinaryRegionComment
                ((BinaryRegionComment *)&prefix_length_1,(BinaryRegionComment *)local_b8);
      anon_unknown_46::MakeBinaryRegion
                (&local_180,header_offset,8,Uint64,0,0,(BinaryRegionComment *)&prefix_length_1);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::push_back
                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                 &prefix_length_comment.index,&local_180);
      BinaryRegion::~BinaryRegion(&local_180);
      BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&prefix_length_1);
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(header_offset + 8);
      prefix_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._15_1_ = 1;
    }
    if ((prefix_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._15_1_ & 1) == 0) {
      local_200 = (_Optional_payload_base<unsigned_int>)
                  ReadScalar<unsigned_int>
                            (this,(uint64_t)
                                  regions.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_200);
      if ((ulong)*puVar3 <= this->binary_length_) {
        BinaryRegionComment::BinaryRegionComment(&local_318,(BinaryRegionComment *)local_b8);
        anon_unknown_46::MakeBinaryRegion
                  (&local_2a0,
                   (uint64_t)
                   regions.
                   super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,4,Uint32,0,0,&local_318);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  &prefix_length_comment.index,&local_2a0);
        BinaryRegion::~BinaryRegion(&local_2a0);
        BinaryRegionComment::~BinaryRegionComment(&local_318);
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(regions.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->offset + 4);
        prefix_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._15_1_ = 1;
      }
    }
    if ((prefix_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._15_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &root_table_offset.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged,"",
                 (allocator<char> *)
                 ((long)&root_table_offset.super__Optional_base<unsigned_int,_true,_true>._M_payload
                         .super__Optional_payload_base<unsigned_int>._M_payload + 3));
      anon_unknown_46::SetError
                ((BinaryRegionComment *)local_b8,ERROR,
                 (string *)
                 &root_table_offset.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged);
      std::__cxx11::string::~string
                ((string *)
                 &root_table_offset.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&root_table_offset.super__Optional_base<unsigned_int,_true,_true>._M_payload
                         .super__Optional_payload_base<unsigned_int>._M_payload + 3));
    }
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_b8);
  }
  register0x00000000 =
       (_Optional_payload_base<unsigned_int>)
       ReadScalar<unsigned_int>
                 (this,(uint64_t)
                       regions.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::optional<unsigned_int>::has_value
                    ((optional<unsigned_int> *)((long)&root_table_loc + 4));
  if (bVar1) {
    puVar3 = std::optional<unsigned_int>::operator*
                       ((optional<unsigned_int> *)((long)&root_table_loc + 4));
    root_offset_comment.index =
         (long)&(regions.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->offset + (ulong)*puVar3;
    BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_3c8);
    root_offset_comment.status_message.field_2._8_4_ = 2;
    this_00 = RootTable(this);
    this_01 = reflection::Object::name(this_00);
    String::str_abi_cxx11_(&local_3e8,this_01);
    std::__cxx11::string::operator=((string *)&root_offset_comment.type,(string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    bVar1 = IsValidOffset(this,root_offset_comment.index);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"",&local_409);
      anon_unknown_46::SetError
                ((BinaryRegionComment *)local_3c8,ERROR_OFFSET_OUT_OF_BINARY,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
    }
    points_to_offset = root_offset_comment.index;
    BinaryRegionComment::BinaryRegionComment
              ((BinaryRegionComment *)&comment.index,(BinaryRegionComment *)local_3c8);
    anon_unknown_46::MakeBinaryRegion
              (&local_4b0,
               (uint64_t)
               regions.
               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,4,UOffset,0,points_to_offset,
               (BinaryRegionComment *)&comment.index);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::push_back
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &prefix_length_comment.index,&local_4b0);
    BinaryRegion::~BinaryRegion(&local_4b0);
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&comment.index);
    offset_00 = (undefined1 *)
                ((long)&(regions.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->offset + 4);
    bVar1 = IsValidRead(this,(uint64_t)offset_00,4);
    if ((bVar1) &&
       (bVar1 = anon_unknown_46::IsPrintableRegion((uint64_t)offset_00,4,this->binary_), bVar1)) {
      BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_5a0);
      comment.status_message.field_2._8_4_ = 3;
      BinaryRegionComment::BinaryRegionComment(&local_6b8,(BinaryRegionComment *)local_5a0);
      anon_unknown_46::MakeBinaryRegion(&local_640,(uint64_t)offset_00,4,Char,4,0,&local_6b8);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::push_back
                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                 &prefix_length_comment.index,&local_640);
      BinaryRegion::~BinaryRegion(&local_640);
      BinaryRegionComment::~BinaryRegionComment(&local_6b8);
      BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_5a0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"",&local_719);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
              (&local_738,
               (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &prefix_length_comment.index);
    anon_unknown_46::MakeBinarySection(&local_6f8,&local_718,Header,&local_738);
    AddSection(this,header_offset,&local_6f8);
    BinarySection::~BinarySection(&local_6f8);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_738);
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator(&local_719);
    this_local = (BinaryAnnotator *)root_offset_comment.index;
    root_table_loc._0_4_ = 1;
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_3c8);
  }
  else {
    this_local = (BinaryAnnotator *)std::numeric_limits<unsigned_long>::max();
    root_table_loc._0_4_ = 1;
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
             &prefix_length_comment.index);
  return (uint64_t)this_local;
}

Assistant:

uint64_t BinaryAnnotator::BuildHeader(const uint64_t header_offset) {
  uint64_t offset = header_offset;
  std::vector<BinaryRegion> regions;

  // If this binary is a size prefixed one, attempt to parse the size.
  if (is_size_prefixed_) {
    BinaryRegionComment prefix_length_comment;
    prefix_length_comment.type = BinaryRegionCommentType::SizePrefix;

    bool has_prefix_value = false;
    const auto prefix_length = ReadScalar<uoffset64_t>(offset);
    if (*prefix_length <= binary_length_) {
      regions.push_back(MakeBinaryRegion(offset, sizeof(uoffset64_t),
                                         BinaryRegionType::Uint64, 0, 0,
                                         prefix_length_comment));
      offset += sizeof(uoffset64_t);
      has_prefix_value = true;
    }

    if (!has_prefix_value) {
      const auto prefix_length = ReadScalar<uoffset_t>(offset);
      if (*prefix_length <= binary_length_) {
        regions.push_back(MakeBinaryRegion(offset, sizeof(uoffset_t),
                                           BinaryRegionType::Uint32, 0, 0,
                                           prefix_length_comment));
        offset += sizeof(uoffset_t);
        has_prefix_value = true;
      }
    }

    if (!has_prefix_value) {
      SetError(prefix_length_comment, BinaryRegionStatus::ERROR);
    }
  }

  const auto root_table_offset = ReadScalar<uint32_t>(offset);

  if (!root_table_offset.has_value()) {
    // This shouldn't occur, since we validate the min size of the buffer
    // before. But for completion sake, we shouldn't read passed the binary end.
    return std::numeric_limits<uint64_t>::max();
  }

  const auto root_table_loc = offset + *root_table_offset;

  BinaryRegionComment root_offset_comment;
  root_offset_comment.type = BinaryRegionCommentType::RootTableOffset;
  root_offset_comment.name = RootTable()->name()->str();

  if (!IsValidOffset(root_table_loc)) {
    SetError(root_offset_comment,
             BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
  }

  regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                     BinaryRegionType::UOffset, 0,
                                     root_table_loc, root_offset_comment));
  offset += sizeof(uint32_t);

  if (IsValidRead(offset, flatbuffers::kFileIdentifierLength) &&
      IsPrintableRegion(offset, flatbuffers::kFileIdentifierLength, binary_)) {
    BinaryRegionComment comment;
    comment.type = BinaryRegionCommentType::FileIdentifier;
    // Check if the file identifier region has non-zero data, and assume its
    // the file identifier. Otherwise, it will get filled in with padding
    // later.
    regions.push_back(MakeBinaryRegion(
        offset, flatbuffers::kFileIdentifierLength * sizeof(uint8_t),
        BinaryRegionType::Char, flatbuffers::kFileIdentifierLength, 0,
        comment));
  }

  AddSection(header_offset, MakeBinarySection("", BinarySectionType::Header,
                                              std::move(regions)));

  return root_table_loc;
}